

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.h
# Opt level: O0

void __thiscall L15_4::LabeledSales::NBadIndex::~NBadIndex(NBadIndex *this)

{
  NBadIndex *this_local;
  
  ~NBadIndex(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~NBadIndex() throw() {}